

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O3

AnimationCurveNodeList * __thiscall
Assimp::FBX::AnimationLayer::Nodes
          (AnimationCurveNodeList *__return_storage_ptr__,AnimationLayer *this,
          char **target_prop_whitelist,size_t whitelist_size)

{
  pointer *pppAVar1;
  char *__s1;
  iterator __position;
  int iVar2;
  Object *pOVar3;
  AnimationCurveNode *pAVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer ppCVar6;
  size_t sVar7;
  AnimationCurveNode *anim;
  string local_70;
  AnimationCurveNode *local_50;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_48
  ;
  
  (__return_storage_ptr__->
  super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Document::GetConnectionsByDestinationSequenced
            (&local_48,this->doc,(this->super_Object).id,"AnimationCurveNode");
  std::
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  ::reserve(__return_storage_ptr__,
            (long)local_48.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_48.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppCVar6 = local_48.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppCVar6 ==
        local_48.
        super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (local_48.
          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    paVar5 = &local_70.field_2;
    if (((*ppCVar6)->prop)._M_string_length == 0) {
      pOVar3 = Connection::SourceObject(*ppCVar6);
      if (pOVar3 == (Object *)0x0) {
        local_70._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,
                   "failed to read source object for AnimationCurveNode->AnimationLayer link, ignoring"
                   ,"");
        Util::DOMWarning(&local_70,(this->super_Object).element);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar5) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      else {
        pAVar4 = (AnimationCurveNode *)
                 __dynamic_cast(pOVar3,&Object::typeinfo,&AnimationCurveNode::typeinfo,0);
        local_50 = pAVar4;
        if (pAVar4 == (AnimationCurveNode *)0x0) {
          local_70._M_dataplus._M_p = (pointer)paVar5;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,
                     "source object for ->AnimationLayer link is not an AnimationCurveNode","");
          Util::DOMWarning(&local_70,(this->super_Object).element);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar5) {
            operator_delete(local_70._M_dataplus._M_p);
          }
        }
        else if (target_prop_whitelist == (char **)0x0) {
LAB_005f7d3c:
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Assimp::FBX::AnimationCurveNode_const*,std::allocator<Assimp::FBX::AnimationCurveNode_const*>>
            ::_M_realloc_insert<Assimp::FBX::AnimationCurveNode_const*const&>
                      ((vector<Assimp::FBX::AnimationCurveNode_const*,std::allocator<Assimp::FBX::AnimationCurveNode_const*>>
                        *)__return_storage_ptr__,__position,&local_50);
          }
          else {
            *__position._M_current = pAVar4;
            pppAVar1 = &(__return_storage_ptr__->
                        super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppAVar1 = *pppAVar1 + 1;
          }
        }
        else if (whitelist_size != 0) {
          __s1 = (pAVar4->prop)._M_dataplus._M_p;
          sVar7 = 0;
          do {
            iVar2 = strcmp(__s1,target_prop_whitelist[sVar7]);
            if (iVar2 == 0) goto LAB_005f7d3c;
            sVar7 = sVar7 + 1;
          } while (whitelist_size != sVar7);
        }
      }
    }
    ppCVar6 = ppCVar6 + 1;
  } while( true );
}

Assistant:

AnimationCurveNodeList AnimationLayer::Nodes(const char* const * target_prop_whitelist /*= NULL*/,
    size_t whitelist_size /*= 0*/) const
{
    AnimationCurveNodeList nodes;

    // resolve attached animation nodes
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"AnimationCurveNode");
    nodes.reserve(conns.size());

    for(const Connection* con : conns) {

        // link should not go to a property
        if (con->PropertyName().length()) {
            continue;
        }

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for AnimationCurveNode->AnimationLayer link, ignoring",&element);
            continue;
        }

        const AnimationCurveNode* const anim = dynamic_cast<const AnimationCurveNode*>(ob);
        if(!anim) {
            DOMWarning("source object for ->AnimationLayer link is not an AnimationCurveNode",&element);
            continue;
        }

        if(target_prop_whitelist) {
            const char* s = anim->TargetProperty().c_str();
            bool ok = false;
            for (size_t i = 0; i < whitelist_size; ++i) {
                if (!strcmp(s, target_prop_whitelist[i])) {
                    ok = true;
                    break;
                }
            }
            if(!ok) {
                continue;
            }
        }
        nodes.push_back(anim);
    }

    return nodes; // pray for NRVO
}